

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O1

void __thiscall
mp::internal::AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
HandleSolution(AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this
              ,int status,CStringRef message,double *values,double *dual_values,double obj_value)

{
  uint uVar1;
  int iVar2;
  TestSolver *this_00;
  pointer pcVar3;
  uint uVar4;
  Result RVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  MemoryWriter w;
  ArgList local_318;
  char *local_308 [3];
  double *local_2f0;
  size_t local_2e8;
  double local_2e0;
  undefined1 local_2d8 [24];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  undefined1 local_2b0 [16];
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  MemoryMappedFileBase local_280;
  undefined **local_270;
  undefined **local_260;
  char *local_258;
  ulong local_248;
  char local_240 [512];
  ArgList local_40;
  
  this_00 = (this->super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
            ).solver_;
  uVar1 = (this_00->super_Solver).super_BasicSolver.wantsol_;
  uVar4 = (this_00->super_Solver).super_BasicSolver.bool_options_ & 2;
  local_2f0 = dual_values;
  if ((uVar1 & 1) != 0 || uVar4 != 0) {
    if (((uVar4 != 0) &&
        (iVar2 = *(int *)&(this->
                          super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                          ).field_0x84, iVar2 != 0)) &&
       (((this_00->super_Solver).super_BasicSolver.output_handler_)->has_output == false)) {
      local_2d8._8_8_ = local_2d8 + 0x10;
      local_2d8._0_8_ = &PTR__BasicMemoryWriter_0028b328;
      local_2c0._M_p = local_2b0 + 8;
      local_2b8 = 0;
      local_2b0._0_8_ = 500;
      local_2d8._16_8_ = &PTR_grow_0028b370;
      local_318.types_._4_4_ = 8;
      local_318.field_1._0_4_ = 0;
      local_308[0] = "";
      local_318.types_._0_4_ = iVar2;
      local_2e0 = obj_value;
      fmt::BasicWriter<char>::write_str<char>
                ((BasicWriter<char> *)local_2d8,"",0,(AlignSpec *)&local_318);
      sVar6 = *(size_t *)(local_2d8._8_8_ + 0x10);
      if (*(size_t *)(local_2d8._8_8_ + 0x18) < sVar6 + 1) {
        local_2e8 = sVar6;
        (***(_func_int ***)local_2d8._8_8_)();
        sVar6 = local_2e8;
      }
      (*(char **)(local_2d8._8_8_ + 8))[sVar6] = '\0';
      local_318.types_._0_4_ = (int)*(char **)(local_2d8._8_8_ + 8);
      local_318.types_._4_4_ = (undefined4)((ulong)*(char **)(local_2d8._8_8_ + 8) >> 0x20);
      local_40.types_ = 10;
      local_40.field_1.values_ = (Value *)&local_318;
      BasicSolver::Print((BasicSolver *)this_00,(CStringRef)0x22cc36,&local_40);
      local_2d8._0_8_ = &PTR__BasicMemoryWriter_0028b328;
      local_2d8._16_8_ = &PTR_grow_0028b370;
      obj_value = local_2e0;
      if (local_2c0._M_p != local_2b0 + 8) {
        operator_delete(local_2c0._M_p,local_2b0._0_8_);
        obj_value = local_2e0;
      }
    }
    SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::HandleSolution
              (&this->
                super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>,
               status,message,values,local_2f0,obj_value);
  }
  if (((this_00->super_Solver).super_BasicSolver.bool_options_ & 2) == 0) {
    if ((uVar1 & 8) == 0) {
      local_2d8._0_8_ =
           message.data_ +
           *(uint *)&(this->
                     super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                     ).field_0x84;
      local_318.field_1.values_ = (Value *)local_2d8;
      local_318.types_._0_4_ = 10;
      local_318.types_._4_4_ = 0;
      BasicSolver::Print((BasicSolver *)this_00,(CStringRef)0x22bbdd,&local_318);
    }
    if ((uVar1 & 2) != 0) {
      RVar5 = MockProblemBuilder::num_vars
                        (&(((this->
                            super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                            ).builder_)->super_StrictMock<MockProblemBuilder>).
                          super_MockProblemBuilder);
      pcVar3 = (this->
               super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>).
               stub_._M_dataplus._M_p;
      local_318.types_ = (uint64_t)local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,pcVar3,
                 pcVar3 + (this->
                          super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                          ).stub_._M_string_length);
      std::__cxx11::string::append((char *)&local_318);
      NameProvider::NameProvider
                ((NameProvider *)local_2d8,(CStringRef)local_318.types_,(CStringRef)0x21c48f,
                 (long)RVar5);
      if ((char **)local_318.types_ != local_308) {
        operator_delete((void *)local_318.types_,(ulong)(local_308[0] + 1));
      }
      PrintSolution(values,RVar5,"variable","value",(NameProvider *)local_2d8);
      local_270 = &PTR__BasicMemoryWriter_0028b328;
      local_260 = &PTR_grow_0028b370;
      if (local_258 != local_240) {
        operator_delete(local_258,local_248);
      }
      MemoryMappedFileBase::~MemoryMappedFileBase(&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if (local_2c0._M_p != local_2b0) {
        operator_delete(local_2c0._M_p,local_2b0._0_8_ + 1);
      }
      if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
      }
    }
    if ((uVar1 & 4) != 0) {
      RVar5 = MockProblemBuilder::num_algebraic_cons
                        (&(((this->
                            super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                            ).builder_)->super_StrictMock<MockProblemBuilder>).
                          super_MockProblemBuilder);
      pcVar3 = (this->
               super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>).
               stub_._M_dataplus._M_p;
      local_318.types_ = (uint64_t)local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,pcVar3,
                 pcVar3 + (this->
                          super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
                          ).stub_._M_string_length);
      std::__cxx11::string::append((char *)&local_318);
      NameProvider::NameProvider
                ((NameProvider *)local_2d8,(CStringRef)local_318.types_,(CStringRef)0x21c4a3,
                 (long)RVar5);
      if ((char **)local_318.types_ != local_308) {
        operator_delete((void *)local_318.types_,(ulong)(local_308[0] + 1));
      }
      PrintSolution(local_2f0,RVar5,"constraint","dual value",(NameProvider *)local_2d8);
      local_270 = &PTR__BasicMemoryWriter_0028b328;
      local_260 = &PTR_grow_0028b370;
      if (local_258 != local_240) {
        operator_delete(local_258,local_248);
      }
      MemoryMappedFileBase::~MemoryMappedFileBase(&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if (local_2c0._M_p != local_2b0) {
        operator_delete(local_2c0._M_p,local_2b0._0_8_ + 1);
      }
      if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
      }
    }
  }
  return;
}

Assistant:

void AppSolutionHandlerImpl<Solver, PB, Writer>::HandleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double obj_value) {
  Solver &solver = this->solver();
  int wantsol = solver.wantsol();
  if (solver.ampl_flag() || (wantsol & Solver::WRITE_SOL_FILE) != 0) {
    // "Erase" the banner so that it is not duplicated when printing
    // the solver message.
    if (solver.ampl_flag() && banner_size_ != 0
        && !solver.output_handler()->has_output) {   // #233
      fmt::MemoryWriter w;
      w << fmt::pad("", banner_size_, '\b');
      solver.Print("{}", w.c_str());
    }
    SolutionWriterImpl<Solver, PB, Writer>::HandleSolution(
          status, message, values, dual_values, obj_value);
  }
  if (solver.ampl_flag())
    return;
  if ((wantsol & Solver::SUPPRESS_SOLVER_MSG) == 0)
    solver.Print("{}\n", message.c_str() + banner_size_);
  using internal::PrintSolution;
  if ((wantsol & Solver::PRINT_SOLUTION) != 0) {
    int num_vars = this->builder().num_vars();
    NameProvider np(this->stub() + ".col", "_svar", num_vars);
    PrintSolution(values, num_vars, "variable", "value", np);
  }
  if ((wantsol & Solver::PRINT_DUAL_SOLUTION) != 0) {
    int num_cons = this->builder().num_algebraic_cons();
    NameProvider np(this->stub() + ".row", "_scon", num_cons);
    PrintSolution(dual_values, num_cons, "constraint", "dual value", np);
  }
}